

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Spill<wabt::(anonymous_namespace)::CWriter::Write(wabt::intrusive_list<wabt::Expr>const&)::__0>
          (CWriter *this,TypeVector *types,anon_class_8_1_f948b21d *src)

{
  pointer args;
  byte bVar1;
  pointer pTVar2;
  Newline *args_00;
  long lVar3;
  int iVar4;
  Newline *in_R8;
  int iVar5;
  uint local_40 [4];
  
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  args = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  lVar3 = (long)args - (long)pTVar2 >> 3;
  if (lVar3 == 1) {
    local_40[0] = *src->num_params;
    local_40[1] = 0;
    local_40[2] = 0;
    Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              (this,(char (*) [7])local_40,(StackVar *)0x1,(char (*) [2])args,in_R8);
  }
  else {
    if (lVar3 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xba2,
                    "void wabt::(anonymous namespace)::CWriter::Spill(const TypeVector &, const sources &) [sources = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:4249:17)]"
                   );
    }
    if (args != pTVar2) {
      iVar4 = 0;
      args_00 = (Newline *)0x0;
      do {
        bVar1 = anon_unknown_0::CWriter::MangleType(pTVar2[(long)args_00]);
        iVar5 = (int)args_00;
        anon_unknown_0::CWriter::Writef((CWriter *)this,"tmp.%c%d = ",(ulong)bVar1);
        local_40[0] = *src->num_params + iVar4;
        local_40[1] = 0;
        local_40[2] = 0;
        Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  (this,(StackVar *)(ulong)local_40[0],(char (*) [2])0x0,args_00);
        args_00 = (Newline *)(ulong)(iVar5 + 1);
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = iVar4 + -1;
      } while (args_00 < (Newline *)
                         ((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3));
    }
  }
  return;
}

Assistant:

void CWriter::Spill(const TypeVector& types, const sources& src) {
  assert(types.size() > 0);

  if (types.size() == 1) {
    Write("tmp = ", src(0), ";", Newline());
    return;
  }

  for (Index i = 0; i < types.size(); ++i) {
    Writef("tmp.%c%d = ", MangleType(types.at(i)), i);
    Write(src(i), ";", Newline());
  }
}